

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidateNamesValueInternal(xmlDocPtr doc,xmlChar *value)

{
  int iVar1;
  int local_30;
  int local_2c;
  int len;
  int val;
  xmlChar *cur;
  xmlChar *value_local;
  xmlDocPtr doc_local;
  
  if (value == (xmlChar *)0x0) {
    doc_local._4_4_ = 0;
  }
  else {
    _len = value;
    cur = value;
    value_local = (xmlChar *)doc;
    local_2c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&local_30);
    _len = _len + local_30;
    iVar1 = xmlIsDocNameStartChar((xmlDocPtr)value_local,local_2c);
    if (iVar1 == 0) {
      doc_local._4_4_ = 0;
    }
    else {
      local_2c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,_len,&local_30);
      _len = _len + local_30;
      while (iVar1 = xmlIsDocNameChar((xmlDocPtr)value_local,local_2c), iVar1 != 0) {
        local_2c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,_len,&local_30);
        _len = _len + local_30;
      }
      while (local_2c == 0x20) {
        while (local_2c == 0x20) {
          local_2c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,_len,&local_30);
          _len = _len + local_30;
        }
        iVar1 = xmlIsDocNameStartChar((xmlDocPtr)value_local,local_2c);
        if (iVar1 == 0) {
          return 0;
        }
        local_2c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,_len,&local_30);
        _len = _len + local_30;
        while (iVar1 = xmlIsDocNameChar((xmlDocPtr)value_local,local_2c), iVar1 != 0) {
          local_2c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,_len,&local_30);
          _len = _len + local_30;
        }
      }
      if (local_2c == 0) {
        doc_local._4_4_ = 1;
      }
      else {
        doc_local._4_4_ = 0;
      }
    }
  }
  return doc_local._4_4_;
}

Assistant:

static int
xmlValidateNamesValueInternal(xmlDocPtr doc, const xmlChar *value) {
    const xmlChar *cur;
    int val, len;

    if (value == NULL) return(0);
    cur = value;
    val = xmlStringCurrentChar(NULL, cur, &len);
    cur += len;

    if (!xmlIsDocNameStartChar(doc, val))
	return(0);

    val = xmlStringCurrentChar(NULL, cur, &len);
    cur += len;
    while (xmlIsDocNameChar(doc, val)) {
	val = xmlStringCurrentChar(NULL, cur, &len);
	cur += len;
    }

    /* Should not test IS_BLANK(val) here -- see erratum E20*/
    while (val == 0x20) {
	while (val == 0x20) {
	    val = xmlStringCurrentChar(NULL, cur, &len);
	    cur += len;
	}

	if (!xmlIsDocNameStartChar(doc, val))
	    return(0);

	val = xmlStringCurrentChar(NULL, cur, &len);
	cur += len;

	while (xmlIsDocNameChar(doc, val)) {
	    val = xmlStringCurrentChar(NULL, cur, &len);
	    cur += len;
	}
    }

    if (val != 0) return(0);

    return(1);
}